

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

void split_node(dtree_t *tr,uint32 node_id,float32 ****mixw,float32 ****means,float32 ****vars,
               uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
               float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 **dfeat,
               uint32 n_dfeat,float32 mwfloor)

{
  uint uVar1;
  uint uVar2;
  uint32 *puVar3;
  int iVar4;
  dtree_node_t *pdVar5;
  uint32 *id_00;
  uint32 *id_01;
  uint local_ac;
  uint32 i;
  uint32 ii;
  uint32 node_id_no;
  uint32 node_id_yes;
  dtree_node_t *node;
  uint32 n_no;
  uint32 *id_no;
  uint32 n_yes;
  uint32 *id_yes;
  uint32 n_id;
  uint32 *id;
  float32 mwfloor_local;
  uint32 *veclen_local;
  float32 ****vars_local;
  float32 ****means_local;
  float32 ****mixw_local;
  uint32 node_id_local;
  dtree_t *tr_local;
  
  pdVar5 = tr->node + node_id;
  puVar3 = pdVar5->id;
  uVar1 = pdVar5->n_id;
  id_no._4_4_ = 0;
  node._4_4_ = 0;
  for (local_ac = 0; local_ac < uVar1; local_ac = local_ac + 1) {
    iVar4 = eval_quest((quest_t *)pdVar5->q,dfeat[puVar3[local_ac]],n_dfeat);
    if (iVar4 == 0) {
      node._4_4_ = node._4_4_ + 1;
    }
    else {
      id_no._4_4_ = id_no._4_4_ + 1;
    }
  }
  id_00 = (uint32 *)
          __ckd_calloc__((ulong)id_no._4_4_,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                         ,0x480);
  id_01 = (uint32 *)
          __ckd_calloc__((ulong)node._4_4_,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                         ,0x481);
  id_no._4_4_ = 0;
  node._4_4_ = 0;
  for (local_ac = 0; local_ac < uVar1; local_ac = local_ac + 1) {
    uVar2 = puVar3[local_ac];
    iVar4 = eval_quest((quest_t *)pdVar5->q,dfeat[uVar2],n_dfeat);
    if (iVar4 == 0) {
      id_01[node._4_4_] = uVar2;
      node._4_4_ = node._4_4_ + 1;
    }
    else {
      id_00[id_no._4_4_] = uVar2;
      id_no._4_4_ = id_no._4_4_ + 1;
    }
  }
  uVar1 = tr->n_node;
  tr->n_node = uVar1 + 1;
  uVar2 = tr->n_node;
  tr->n_node = uVar2 + 1;
  pdVar5->y = tr->node + uVar1;
  pdVar5->n = tr->node + uVar2;
  pdVar5->y->p = pdVar5;
  pdVar5->n->p = pdVar5;
  mk_node(pdVar5->y,uVar1,id_00,id_no._4_4_,mixw,means,vars,veclen,n_model,n_state,n_stream,
          n_density,stwt,mwfloor);
  set_best_quest(pdVar5->y,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,all_q,
                 n_all_q,pset,dfeat,n_dfeat,mwfloor);
  mk_node(pdVar5->n,uVar2,id_01,node._4_4_,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density
          ,stwt,mwfloor);
  set_best_quest(pdVar5->n,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,all_q,
                 n_all_q,pset,dfeat,n_dfeat,mwfloor);
  return;
}

Assistant:

void
split_node(dtree_t *tr,
	   uint32 node_id,
	   float32 ****mixw,
           float32 ****means,
           float32 ****vars,
           uint32 *veclen,
	   uint32 n_model,
	   uint32 n_state,
	   uint32 n_stream,
	   uint32 n_density,
	   float32 *stwt,

	   quest_t *all_q,
	   uint32 n_all_q,
	   pset_t *pset,
	   
	   uint32 **dfeat,
	   uint32 n_dfeat,

	   float32 mwfloor)
{
    uint32 *id, n_id;
    uint32 *id_yes, n_yes;
    uint32 *id_no, n_no;
    dtree_node_t *node;
    uint32 node_id_yes;
    uint32 node_id_no;
    uint32 ii, i;

    node = &tr->node[node_id];

    id = node->id;
    n_id = node->n_id;

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_quest((quest_t *)node->q, dfeat[i], n_dfeat)) {
	    ++n_yes;
	}
	else {
	    ++n_no;
	}
    }

#if 0
    fprintf(stderr, "Split: (");
    print_quest(stderr, pset, (quest_t *)node->q);
    fprintf(stderr, ") %u/%u %.3e\n", n_yes, n_no, node->wt_ent_dec);
#endif

    id_yes = ckd_calloc(n_yes, sizeof(uint32));
    id_no = ckd_calloc(n_no, sizeof(uint32));

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_quest((quest_t *)node->q, dfeat[i], n_dfeat)) {
	    id_yes[n_yes] = i;
	    ++n_yes;
	}
	else {
	    id_no[n_no] = i;
	    ++n_no;
	}
    }

    node_id_yes = tr->n_node++;
    node_id_no = tr->n_node++;

    node->y = &tr->node[node_id_yes];
    node->n = &tr->node[node_id_no];
    node->y->p = node;
    node->n->p = node;

    mk_node(node->y,
	    node_id_yes,
	    id_yes, n_yes,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    set_best_quest(node->y,
		   mixw,
                   means,
                   vars,
                   veclen,
		   n_model,
		   n_state,
		   n_stream,
		   n_density,
		   stwt,
		   all_q, n_all_q, pset,
		   dfeat, n_dfeat,
		   mwfloor);

    mk_node(node->n,
	    node_id_no,
	    id_no, n_no,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    set_best_quest(node->n,
		   mixw,
                   means,
                   vars,
                   veclen,
		   n_model,
		   n_state,
		   n_stream,
		   n_density,
		   stwt,
		   all_q, n_all_q, pset,
		   dfeat, n_dfeat,
		   mwfloor);
}